

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_254152::AlsaPlayback::open(AlsaPlayback *this,char *__file,int __oflag,...)

{
  ALCdevice *pAVar1;
  pointer pDVar2;
  int iVar3;
  char *pcVar4;
  backend_exception *this_00;
  long lVar5;
  pointer pDVar6;
  long lVar7;
  pointer pDVar8;
  vector<DevMap> local_68;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_> local_48
  ;
  
  if (__file == (char *)0x0) {
    pcVar4 = GetConfigValue((char *)0x0,"alsa","device","default");
    __file = "ALSA Default";
  }
  else {
    if ((anonymous_namespace)::PlaybackDevices == DAT_0022d298) {
      probe_devices(&local_68,SND_PCM_STREAM_PLAYBACK);
      local_48.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = DAT_0022d2a0;
      local_48.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_finish = DAT_0022d298;
      local_48.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start = (anonymous_namespace)::PlaybackDevices;
      DAT_0022d2a0 = local_68.
                     super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (anonymous_namespace)::PlaybackDevices =
           local_68.
           super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
      DAT_0022d298 = local_68.
                     super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector(&local_48);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector(&local_68);
    }
    pDVar2 = DAT_0022d298;
    lVar7 = (long)DAT_0022d298 - (long)(anonymous_namespace)::PlaybackDevices;
    pDVar8 = (anonymous_namespace)::PlaybackDevices;
    if (0 < lVar7 >> 8) {
      lVar5 = (lVar7 >> 8) + 1;
      do {
        iVar3 = std::__cxx11::string::compare((char *)pDVar8);
        pDVar6 = pDVar8;
        if (iVar3 == 0) goto LAB_00161169;
        iVar3 = std::__cxx11::string::compare((char *)(pDVar8 + 1));
        pDVar6 = pDVar8 + 1;
        if (iVar3 == 0) goto LAB_00161169;
        iVar3 = std::__cxx11::string::compare((char *)(pDVar8 + 2));
        pDVar6 = pDVar8 + 2;
        if (iVar3 == 0) goto LAB_00161169;
        iVar3 = std::__cxx11::string::compare((char *)(pDVar8 + 3));
        pDVar6 = pDVar8 + 3;
        if (iVar3 == 0) goto LAB_00161169;
        pDVar8 = pDVar8 + 4;
        lVar5 = lVar5 + -1;
        lVar7 = lVar7 + -0x100;
      } while (1 < lVar5);
    }
    lVar7 = lVar7 >> 6;
    if (lVar7 == 1) {
LAB_00161128:
      iVar3 = std::__cxx11::string::compare((char *)pDVar8);
      pDVar6 = pDVar2;
      if (iVar3 == 0) {
        pDVar6 = pDVar8;
      }
    }
    else if (lVar7 == 2) {
LAB_00161115:
      iVar3 = std::__cxx11::string::compare((char *)pDVar8);
      pDVar6 = pDVar8;
      if (iVar3 != 0) {
        pDVar8 = pDVar8 + 1;
        goto LAB_00161128;
      }
    }
    else {
      pDVar6 = pDVar2;
      if ((lVar7 == 3) &&
         (iVar3 = std::__cxx11::string::compare((char *)pDVar8), pDVar6 = pDVar8, iVar3 != 0)) {
        pDVar8 = pDVar8 + 1;
        goto LAB_00161115;
      }
    }
LAB_00161169:
    if (pDVar6 == DAT_0022d298) {
      this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(this_00,0xa004,"Device name \"%s\" not found",__file)
      ;
      goto LAB_0016124c;
    }
    pcVar4 = (pDVar6->device_name)._M_dataplus._M_p;
  }
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Opening device \"%s\"\n",pcVar4);
  }
  iVar3 = (*(anonymous_namespace)::psnd_pcm_open)(&this->mPcmHandle,pcVar4,0,1);
  if (-1 < iVar3) {
    (*(anonymous_namespace)::psnd_config_update_free_global)();
    pAVar1 = (this->super_BackendBase).mDevice;
    pcVar4 = (char *)(pAVar1->DeviceName)._M_string_length;
    strlen(__file);
    iVar3 = std::__cxx11::string::_M_replace((ulong)&pAVar1->DeviceName,0,pcVar4,(ulong)__file);
    return iVar3;
  }
  this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception
            (this_00,0xa005,"Could not open ALSA device \"%s\"",pcVar4);
LAB_0016124c:
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void AlsaPlayback::open(const ALCchar *name)
{
    const char *driver{};
    if(name)
    {
        if(PlaybackDevices.empty())
            PlaybackDevices = probe_devices(SND_PCM_STREAM_PLAYBACK);

        auto iter = std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(),
            [name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == PlaybackDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        driver = iter->device_name.c_str();
    }
    else
    {
        name = alsaDevice;
        driver = GetConfigValue(nullptr, "alsa", "device", "default");
    }

    TRACE("Opening device \"%s\"\n", driver);
    int err{snd_pcm_open(&mPcmHandle, driver, SND_PCM_STREAM_PLAYBACK, SND_PCM_NONBLOCK)};
    if(err < 0)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "Could not open ALSA device \"%s\"",
            driver};

    /* Free alsa's global config tree. Otherwise valgrind reports a ton of leaks. */
    snd_config_update_free_global();

    mDevice->DeviceName = name;
}